

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_revsurface.cpp
# Opt level: O0

ON_Interval __thiscall ON_RevSurface::Domain(ON_RevSurface *this,int dir)

{
  ON_RevSurface *extraout_XMM0_Qa;
  double in_XMM1_Qa;
  ON_Interval OVar1;
  int local_24;
  int dir_local;
  ON_RevSurface *this_local;
  ON_Interval d;
  
  ON_Interval::ON_Interval((ON_Interval *)&this_local);
  local_24 = dir;
  if ((this->m_bTransposed & 1U) != 0) {
    local_24 = 1 - dir;
  }
  if (local_24 == 0) {
    this_local = (ON_RevSurface *)(this->m_t).m_t[0];
    d.m_t[0] = (this->m_t).m_t[1];
  }
  else if ((local_24 == 1) && (this->m_curve != (ON_Curve *)0x0)) {
    (*(this->m_curve->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x25])();
    this_local = extraout_XMM0_Qa;
    d.m_t[0] = in_XMM1_Qa;
  }
  OVar1.m_t[0] = (double)this_local;
  OVar1.m_t[1] = d.m_t[0];
  return (ON_Interval)OVar1.m_t;
}

Assistant:

ON_Interval ON_RevSurface::Domain( int dir ) const
{
  ON_Interval d;
  if ( m_bTransposed )
    dir = 1-dir;
  if ( dir == 0 )
  {
    d = m_t;
  }
  else if ( dir == 1 && m_curve )
  {
    d = m_curve->Domain();
  }
  return d;
}